

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_device
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  byte bVar1;
  uint16_t *extent_index_00;
  uint16_t write_index_00;
  bool bVar2;
  char cVar3;
  State SVar4;
  element_type *peVar5;
  char *__nptr;
  Atom *this_00;
  shared_ptr<r_comp::RepliStruct> local_190;
  allocator local_179;
  string local_178 [36];
  State local_154;
  shared_ptr<r_comp::RepliStruct> local_150;
  State local_13c;
  State s;
  invalid_argument *ia;
  longlong local_128;
  uintptr_t h;
  char *p_1;
  string local_110 [32];
  shared_ptr<r_comp::RepliStruct> local_f0;
  shared_ptr<r_comp::RepliStruct> local_e0;
  shared_ptr<r_comp::RepliStruct> local_d0;
  Class local_c0;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  byte local_41;
  uint16_t *puStack_40;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_30;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *pPStack_20;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_41 = write;
  puStack_40 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_30 = p;
  p_local._7_1_ = enforce;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_58,node);
  bVar2 = read_nil_did(this,&local_58,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_78,node);
    write_index_00 = extent_index_local._6_2_;
    extent_index_00 = puStack_40;
    bVar1 = local_41;
    Class::Class(&local_c0,DEVICE_ID);
    bVar2 = read_variable(this,local_78,write_index_00,extent_index_00,(bool)(bVar1 & 1),&local_c0);
    Class::~Class(&local_c0);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_d0,node);
      bVar2 = read_reference(this,&local_d0,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1)
                             ,DEVICE_ID);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_d0);
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
        bVar2 = read_wildcard(this,&local_e0,extent_index_local._6_2_,puStack_40,
                              (bool)(local_41 & 1));
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else {
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_f0,node);
          bVar2 = read_tail_wildcard(this,&local_f0,extent_index_local._6_2_,puStack_40,
                                     (bool)(local_41 & 1));
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_f0);
          if (bVar2) {
            this_local._7_1_ = true;
          }
          else {
            peVar5 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)node);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_110,"0x",(allocator *)((long)&p_1 + 7));
            bVar2 = r_code::Utils::StartsWith(&peVar5->cmd,(string *)local_110);
            std::__cxx11::string::~string(local_110);
            std::allocator<char>::~allocator((allocator<char> *)((long)&p_1 + 7));
            if (bVar2) {
              std::
              __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)node);
              __nptr = (char *)std::__cxx11::string::c_str();
              local_128 = strtoll(__nptr,(char **)&h,0x10);
              if (*(char *)h == '\0') {
                r_code::Atom::Atom((Atom *)((long)&ia + 4),(uint)local_128);
                cVar3 = r_code::Atom::getDescriptor();
                r_code::Atom::~Atom((Atom *)((long)&ia + 4));
                if (cVar3 == -0x5f) {
                  if ((local_41 & 1) != 0) {
                    r_code::Atom::Atom((Atom *)&ia,(uint)local_128);
                    this_00 = r_code::vector<r_code::Atom>::operator[]
                                        ((vector<r_code::Atom> *)(this->current_object + 8),
                                         (ulong)extent_index_local._6_2_);
                    r_code::Atom::operator=(this_00,(Atom *)&ia);
                    r_code::Atom::~Atom((Atom *)&ia);
                  }
                  return true;
                }
              }
            }
            SVar4 = save_state(this);
            local_13c._0_3_ = SVar4._0_3_;
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_150,node);
            bVar2 = expression(this,&local_150,DEVICE_ID,extent_index_local._6_2_,puStack_40,
                               (bool)(local_41 & 1));
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_150);
            if (bVar2) {
              this_local._7_1_ = true;
            }
            else {
              local_154 = local_13c;
              restore_state(this,local_13c);
              if ((p_local._7_1_ & 1) == 0) {
                this_local._7_1_ = false;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_178," error: expected a device id",&local_179);
                std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_190,node);
                set_error(this,(string *)local_178,&local_190);
                std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_190);
                std::__cxx11::string::~string(local_178);
                std::allocator<char>::~allocator((allocator<char> *)&local_179);
                this_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::read_device(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write) // p always NULL.
{
    if (read_nil_did(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, DEVICE_ID)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, DEVICE_ID)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (Utils::StartsWith(node->cmd, "0x")) {
        try {
            char *p;
            uintptr_t h = std::strtoll(node->cmd.c_str(), &p, 16);

            if (*p == 0) {
                if (Atom(h).getDescriptor() == Atom::DEVICE) {
                    if (write) {
                        current_object->code[write_index] = Atom(h);
                    }

                    return true;
                }
            }
        } catch (const std::invalid_argument &ia) { }
    }

    State s = save_state();

    if (expression(node, DEVICE_ID, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a device id", node);
        return false;
    }

    return false;
}